

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afangles.c
# Opt level: O2

void af_sort_and_quantize_widths(FT_UInt *count,AF_Width table,FT_Pos threshold)

{
  FT_Pos FVar1;
  FT_Pos FVar2;
  FT_Pos FVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  AF_Width pAVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  FT_UInt FVar12;
  AF_Width pAVar13;
  FT_Pos FVar14;
  AF_WidthRec swap;
  
  FVar12 = *count;
  if (FVar12 != 1) {
    for (uVar4 = 1; uVar11 = uVar4, uVar4 < FVar12; uVar4 = uVar4 + 1) {
      while( true ) {
        uVar8 = uVar11 - 1;
        if (uVar11 == 0) break;
        if (table[uVar8].org <= table[uVar11].org) break;
        pAVar7 = table + uVar11;
        pAVar13 = table + uVar8;
        FVar14 = pAVar7->fit;
        FVar1 = pAVar7->org;
        FVar2 = pAVar7->cur;
        pAVar7->fit = pAVar13->fit;
        FVar3 = pAVar13->cur;
        pAVar7->org = pAVar13->org;
        pAVar7->cur = FVar3;
        pAVar13->fit = FVar14;
        pAVar13->org = FVar1;
        pAVar13->cur = FVar2;
        uVar11 = uVar8;
      }
      FVar12 = *count;
    }
    FVar14 = table->org;
    uVar4 = FVar12 - 1;
    uVar5 = 0;
    for (uVar11 = 1; uVar11 < FVar12; uVar11 = uVar11 + 1) {
      lVar9 = table[uVar11].org - FVar14;
      if ((uVar11 == uVar4) || (threshold < lVar9)) {
        uVar11 = (lVar9 <= threshold && uVar11 == uVar4) + uVar11;
        pAVar7 = table + uVar5;
        lVar9 = 0;
        for (uVar10 = uVar5; uVar10 < uVar11; uVar10 = uVar10 + 1) {
          lVar9 = lVar9 + pAVar7->org;
          pAVar7->org = 0;
          pAVar7 = pAVar7 + 1;
        }
        table[uVar5].org = lVar9 / (long)(uVar10 & 0xffffffff);
        if (uVar11 < uVar4) {
          uVar5 = (ulong)(uVar11 + 1);
          FVar14 = table[uVar5].org;
        }
      }
    }
    pAVar7 = table + 1;
    uVar5 = 1;
    for (uVar10 = 1; uVar10 < FVar12; uVar10 = uVar10 + 1) {
      uVar6 = uVar5;
      if (pAVar7->org != 0) {
        uVar6 = (ulong)((FT_UInt)uVar5 + 1);
        table[uVar5].fit = pAVar7->fit;
        FVar14 = pAVar7->cur;
        table[uVar5].org = pAVar7->org;
        table[uVar5].cur = FVar14;
        FVar12 = *count;
      }
      pAVar7 = pAVar7 + 1;
      uVar5 = uVar6;
    }
    *count = (FT_UInt)uVar5;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_sort_and_quantize_widths( FT_UInt*  count,
                               AF_Width  table,
                               FT_Pos    threshold )
  {
    FT_UInt      i, j;
    FT_UInt      cur_idx;
    FT_Pos       cur_val;
    FT_Pos       sum;
    AF_WidthRec  swap;


    if ( *count == 1 )
      return;

    /* sort */
    for ( i = 1; i < *count; i++ )
    {
      for ( j = i; j > 0; j-- )
      {
        if ( table[j].org >= table[j - 1].org )
          break;

        swap         = table[j];
        table[j]     = table[j - 1];
        table[j - 1] = swap;
      }
    }

    cur_idx = 0;
    cur_val = table[cur_idx].org;

    /* compute and use mean values for clusters not larger than  */
    /* `threshold'; this is very primitive and might not yield   */
    /* the best result, but normally, using reference character  */
    /* `o', `*count' is 2, so the code below is fully sufficient */
    for ( i = 1; i < *count; i++ )
    {
      if ( table[i].org - cur_val > threshold ||
           i == *count - 1                    )
      {
        sum = 0;

        /* fix loop for end of array */
        if ( table[i].org - cur_val <= threshold &&
             i == *count - 1                     )
          i++;

        for ( j = cur_idx; j < i; j++ )
        {
          sum         += table[j].org;
          table[j].org = 0;
        }
        table[cur_idx].org = sum / (FT_Pos)j;

        if ( i < *count - 1 )
        {
          cur_idx = i + 1;
          cur_val = table[cur_idx].org;
        }
      }
    }

    cur_idx = 1;

    /* compress array to remove zero values */
    for ( i = 1; i < *count; i++ )
    {
      if ( table[i].org )
        table[cur_idx++] = table[i];
    }

    *count = cur_idx;
  }